

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

void kbd_callback(char *name,int name_len,char *instruction,int instruction_len,int num_prompts,
                 LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses
                 ,void **abstract)

{
  char *pcVar1;
  bool local_449 [9];
  char buf [1024];
  size_t local_40;
  size_t n;
  int i;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts_local;
  int num_prompts_local;
  int instruction_len_local;
  char *instruction_local;
  int name_len_local;
  char *name_local;
  
  fprintf(_stderr,"Performing keyboard-interactive authentication.\n");
  fprintf(_stderr,"Authentication name: \'");
  fwrite(name,1,(long)name_len,_stderr);
  fprintf(_stderr,"\'\n");
  fprintf(_stderr,"Authentication instruction: \'");
  fwrite(instruction,1,(long)instruction_len,_stderr);
  fprintf(_stderr,"\'\n");
  fprintf(_stderr,"Number of prompts: %d\n\n",(ulong)(uint)num_prompts);
  for (n._4_4_ = 0; (int)n._4_4_ < num_prompts; n._4_4_ = n._4_4_ + 1) {
    fprintf(_stderr,"Prompt %d from server: \'",(ulong)n._4_4_);
    fwrite(prompts[(int)n._4_4_].text,1,prompts[(int)n._4_4_].length,_stderr);
    fprintf(_stderr,"\'\n");
    fprintf(_stderr,"Please type response: ");
    fgets((char *)((long)local_449 + 1),0x400,_stdin);
    local_40 = strlen((char *)((long)local_449 + 1));
    while( true ) {
      local_449[0] = false;
      if (local_40 != 0) {
        pcVar1 = strchr("\r\n",(int)local_449[local_40]);
        local_449[0] = pcVar1 != (char *)0x0;
      }
      if (local_449[0] == false) break;
      local_40 = local_40 - 1;
    }
    local_449[local_40 + 1] = false;
    pcVar1 = strdup((char *)((long)local_449 + 1));
    responses[(int)n._4_4_].text = pcVar1;
    responses[(int)n._4_4_].length = (uint)local_40;
    fprintf(_stderr,"Response %d from user is \'",(ulong)n._4_4_);
    fwrite(responses[(int)n._4_4_].text,1,(ulong)responses[(int)n._4_4_].length,_stderr);
    fprintf(_stderr,"\'\n\n");
  }
  fprintf(_stderr,"Done. Sending keyboard-interactive responses to server now.\n");
  return;
}

Assistant:

static void kbd_callback(const char *name, int name_len,
                         const char *instruction, int instruction_len,
                         int num_prompts,
                         const LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,
                         LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses,
                         void **abstract)
{
    int i;
    size_t n;
    char buf[1024];
    (void)abstract;

    fprintf(stderr, "Performing keyboard-interactive authentication.\n");

    fprintf(stderr, "Authentication name: '");
    fwrite(name, 1, name_len, stderr);
    fprintf(stderr, "'\n");

    fprintf(stderr, "Authentication instruction: '");
    fwrite(instruction, 1, instruction_len, stderr);
    fprintf(stderr, "'\n");

    fprintf(stderr, "Number of prompts: %d\n\n", num_prompts);

    for(i = 0; i < num_prompts; i++) {
        fprintf(stderr, "Prompt %d from server: '", i);
        fwrite(prompts[i].text, 1, prompts[i].length, stderr);
        fprintf(stderr, "'\n");

        fprintf(stderr, "Please type response: ");
        fgets(buf, sizeof(buf), stdin);
        n = strlen(buf);
        while(n > 0 && strchr("\r\n", buf[n - 1]))
            n--;
        buf[n] = 0;

        responses[i].text = strdup(buf);
        responses[i].length = (unsigned int)n;

        fprintf(stderr, "Response %d from user is '", i);
        fwrite(responses[i].text, 1, responses[i].length, stderr);
        fprintf(stderr, "'\n\n");
    }

    fprintf(stderr,
        "Done. Sending keyboard-interactive responses to server now.\n");
}